

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_uuid.c
# Opt level: O2

void uuid_generate_time(uchar *out)

{
  short *psVar1;
  int *piVar2;
  uuid *uu;
  bool bVar3;
  int iVar4;
  int iVar5;
  __pid_t __pid;
  long lVar6;
  time_t tVar7;
  ssize_t sVar8;
  ssize_t sVar9;
  int32_t reply_len;
  char local_178;
  int iStack_177;
  undefined3 uStack_173;
  undefined8 uStack_170;
  sockaddr_un srv_addr;
  stat local_c0;
  
  lVar6 = __tls_get_addr();
  piVar2 = (int *)(lVar6 + 8);
  if (((0 < *piVar2) && (tVar7 = time((time_t *)0x0), tVar7 <= *(long *)(lVar6 + 0x20) + 1)) &&
     (iVar4 = *piVar2, 0 < iVar4)) {
    uu = (uuid *)(lVar6 + 0xc);
    uu->time_low = uu->time_low + 1;
    if (uu->time_low == 0) {
      psVar1 = (short *)(lVar6 + 0x10);
      *psVar1 = *psVar1 + 1;
      if (*psVar1 == 0) {
        *(short *)(lVar6 + 0x12) = *(short *)(lVar6 + 0x12) + 1;
      }
    }
    *piVar2 = iVar4 + -1;
    uuid_pack(uu,out);
    return;
  }
  *piVar2 = 1000;
  reply_len = 0;
  iVar4 = socket(1,1,0);
  if (iVar4 < 0) goto LAB_0068edea;
  srv_addr.sun_family = 1;
  builtin_strncpy(srv_addr.sun_path,"/var/lib/libuuid/request",0x19);
  iVar5 = connect(iVar4,(sockaddr *)&srv_addr,0x6e);
  if (iVar5 < 0) {
    if (get_uuid_via_daemon_access_ret == -2) {
      get_uuid_via_daemon_access_ret = access("/usr/sbin/uuidd",1);
    }
    if ((((get_uuid_via_daemon_access_ret == 0) &&
         (get_uuid_via_daemon_access_ret = stat("/usr/sbin/uuidd",&local_c0),
         get_uuid_via_daemon_access_ret == 0)) &&
        (((local_c0.st_mode._1_1_ & 0xc) != 0 ||
         (get_uuid_via_daemon_access_ret = access("/var/lib/libuuid",2),
         get_uuid_via_daemon_access_ret == 0)))) &&
       (iVar5 = get_uuid_via_daemon_start_attempts + 1,
       bVar3 = get_uuid_via_daemon_start_attempts < 5, get_uuid_via_daemon_start_attempts = iVar5,
       bVar3)) {
      __pid = fork();
      if (__pid == 0) {
        close_all_fds();
        execl("/usr/sbin/uuidd","uuidd","-qT","300",0);
        exit(1);
      }
      waitpid(__pid,(int *)0x0,0);
      iVar5 = connect(iVar4,(sockaddr *)&srv_addr,0x6e);
      if (-1 < iVar5) goto LAB_0068ed10;
    }
  }
  else {
LAB_0068ed10:
    local_178 = '\x04';
    iStack_177 = *piVar2;
    sVar8 = write(iVar4,&local_178,5);
    if (((0 < sVar8) && (sVar9 = read_all(iVar4,(char *)&reply_len,4), -1 < sVar9)) &&
       (reply_len == 0x14)) {
      sVar9 = read_all(iVar4,&local_178,0x14);
      *(ulong *)out = CONCAT35(uStack_173,CONCAT41(iStack_177,local_178));
      *(undefined8 *)(out + 8) = uStack_170;
      close(iVar4);
      if (sVar9 == 0x14) {
        tVar7 = time((time_t *)0x0);
        *(time_t *)(lVar6 + 0x20) = tVar7;
        uuid_unpack(out,(uuid *)(lVar6 + 0xc));
        *piVar2 = *piVar2 + -1;
        return;
      }
      goto LAB_0068edea;
    }
  }
  close(iVar4);
LAB_0068edea:
  *piVar2 = 0;
  uuid__generate_time(out,(int *)0x0);
  return;
}

Assistant:

void uuid_generate_time(uuid_t out)
{
#ifdef TLS
	THREAD_LOCAL int		num = 0;
	THREAD_LOCAL struct uuid	uu;
	THREAD_LOCAL time_t		last_time = 0;
	time_t				now;

	if (num > 0) {
		now = time(0);
		if (now > last_time+1)
			num = 0;
	}
	if (num <= 0) {
		num = 1000;
		if (get_uuid_via_daemon(UUIDD_OP_BULK_TIME_UUID,
					out, &num) == 0) {
			last_time = time(0);
			uuid_unpack(out, &uu);
			num--;
			return;
		}
		num = 0;
	}
	if (num > 0) {
		uu.time_low++;
		if (uu.time_low == 0) {
			uu.time_mid++;
			if (uu.time_mid == 0)
				uu.time_hi_and_version++;
		}
		num--;
		uuid_pack(&uu, out);
		return;
	}
#else
	if (get_uuid_via_daemon(UUIDD_OP_TIME_UUID, out, 0) == 0)
		return;
#endif

	uuid__generate_time(out, 0);
}